

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTracerViewer.cpp
# Opt level: O1

void __thiscall
PathTracerViewer::create_gen_graphics_pipeline
          (PathTracerViewer *this,shared_ptr<myvk::Device> *device)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 this_00;
  undefined8 this_01;
  initializer_list<std::shared_ptr<myvk::DescriptorSetLayout>_> __l;
  initializer_list<VkPushConstantRange> __l_00;
  initializer_list<VkPipelineShaderStageCreateInfo> __l_01;
  initializer_list<VkDynamicState> __l_02;
  vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
  shader_stages;
  uint32_t kPathTracerViewerGenFragSpirv [460];
  allocator_type local_a4a;
  allocator_type local_a49;
  undefined1 local_a48 [32];
  undefined1 local_a28 [44];
  undefined4 local_9fc;
  undefined1 local_9f8 [16];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_9e8;
  element_type *local_9e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_9d8;
  VkSpecializationInfo *local_9d0;
  undefined1 auStack_9c8 [16];
  VertexInputState local_9b8;
  InputAssemblyState local_950;
  VkStructureType local_928;
  void *local_920;
  undefined8 uStack_918;
  bool local_910;
  ViewportState local_908;
  MultisampleState local_8a0;
  VkStructureType local_868;
  void *local_860;
  undefined8 uStack_858;
  undefined8 local_850;
  undefined8 uStack_848;
  undefined1 local_840 [32];
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 local_810;
  undefined8 uStack_808;
  bool local_800;
  ColorBlendState local_7f8;
  DynamicState local_7a0;
  vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
  local_758 [76];
  
  peVar1 = (this->m_path_tracer_ptr).super___shared_ptr<PathTracer,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_a48._0_8_ =
       (peVar1->m_target_descriptor_set_layout).
       super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_a48._8_8_ =
       (peVar1->m_target_descriptor_set_layout).
       super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a48._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a48._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a48._8_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a48._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a48._8_8_)->_M_use_count + 1;
    }
  }
  __l._M_len = 1;
  __l._M_array = (iterator)local_a48;
  std::
  vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
  ::vector(local_758,__l,&local_a4a);
  local_a28._36_8_ = 0x10;
  local_9fc = 4;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)(local_a28 + 0x24);
  std::vector<VkPushConstantRange,_std::allocator<VkPushConstantRange>_>::vector
            ((vector<VkPushConstantRange,_std::allocator<VkPushConstantRange>_> *)local_9f8,__l_00,
             &local_a49);
  myvk::PipelineLayout::Create
            ((PipelineLayout *)local_a28,device,local_758,
             (vector<VkPushConstantRange,_std::allocator<VkPushConstantRange>_> *)local_9f8);
  uVar4 = local_a28._8_8_;
  uVar3 = local_a28._0_8_;
  local_a28._0_8_ = (pointer)0x0;
  local_a28._8_8_ = (pointer)0x0;
  p_Var2 = (this->m_gen_pipeline_layout).
           super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->m_gen_pipeline_layout).super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)uVar3;
  (this->m_gen_pipeline_layout).super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if ((pointer)local_a28._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a28._8_8_);
  }
  if ((ShaderModule *)local_9f8._0_8_ != (ShaderModule *)0x0) {
    operator_delete((void *)local_9f8._0_8_,(long)local_9e8._M_pi - local_9f8._0_8_);
  }
  std::
  vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
  ::~vector(local_758);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a48._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a48._8_8_);
  }
  memcpy(local_758,&DAT_00276da0,0x730);
  myvk::ShaderModule::Create((ShaderModule *)local_9f8,device,kQuadVertSpv,0x354);
  this_00 = local_9f8._8_8_;
  uVar3 = local_9f8._0_8_;
  local_9f8._8_8_ = (element_type *)0x0;
  local_9f8._0_8_ = (ShaderModule *)0x0;
  myvk::ShaderModule::Create((ShaderModule *)local_9f8,device,(uint32_t *)local_758,0x730);
  this_01 = local_9f8._8_8_;
  uVar4 = local_9f8._0_8_;
  local_9f8._8_8_ = (element_type *)0x0;
  local_9f8._0_8_ = (pointer)0x0;
  myvk::ShaderModule::GetPipelineShaderStageCreateInfo
            ((VkPipelineShaderStageCreateInfo *)local_9f8,(ShaderModule *)uVar3,
             VK_SHADER_STAGE_VERTEX_BIT,(VkSpecializationInfo *)0x0);
  myvk::ShaderModule::GetPipelineShaderStageCreateInfo
            ((VkPipelineShaderStageCreateInfo *)auStack_9c8,(ShaderModule *)uVar4,
             VK_SHADER_STAGE_FRAGMENT_BIT,(VkSpecializationInfo *)0x0);
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)local_9f8;
  std::vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>::
  vector((vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
          *)local_a28,__l_01,(allocator_type *)local_a48);
  local_9f8._0_4_ = 0x17;
  local_9f8._8_8_ = (element_type *)0x0;
  local_9e8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_9e0 = (element_type *)0x0;
  _Stack_9d8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_9d0 = (VkSpecializationInfo *)0x0;
  auStack_9c8._0_8_ = 0;
  auStack_9c8._8_4_ = 0.0;
  local_9b8.m_bindings.
  super__Vector_base<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_9b8.m_bindings.
  super__Vector_base<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_9b8.m_bindings.
  super__Vector_base<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_9b8.m_attributes.
  super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_9b8.m_attributes.
  super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_9b8.m_attributes.
  super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_9b8.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  local_9b8.m_create_info.pVertexAttributeDescriptions = (VkVertexInputAttributeDescription *)0x0;
  local_9b8.m_enable = false;
  local_9b8.m_create_info.pNext = (void *)0x0;
  local_9b8.m_create_info.flags = 0;
  local_9b8.m_create_info.vertexBindingDescriptionCount = 0;
  local_9b8.m_create_info.pVertexBindingDescriptions._0_4_ = 0;
  local_9b8.m_create_info._28_8_ = 0;
  local_950.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
  local_950.m_enable = false;
  local_950.m_create_info.pNext = (void *)0x0;
  local_950.m_create_info.flags = 0;
  local_950.m_create_info.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  local_950.m_create_info.primitiveRestartEnable = 0;
  local_928 = VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_STATE_CREATE_INFO;
  local_910 = false;
  local_920 = (void *)0x0;
  uStack_918._0_4_ = 0;
  uStack_918._4_4_ = 0;
  local_908.m_scissors.super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_908.m_scissors.super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_908.m_viewports.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_908.m_scissors.super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_908.m_viewports.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_908.m_viewports.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_908.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  local_908.m_create_info.pScissors = (VkRect2D *)0x0;
  local_908.m_enable = false;
  local_908.m_create_info.pNext = (void *)0x0;
  local_908.m_create_info.flags = 0;
  local_908.m_create_info.viewportCount = 0;
  local_908.m_create_info.pViewports._0_4_ = 0;
  local_908.m_create_info._28_8_ = 0;
  local_8a0.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  local_8a0.m_create_info.alphaToCoverageEnable._0_1_ = 0;
  local_8a0._41_8_ = 0;
  local_8a0.m_create_info.sampleShadingEnable = 0;
  local_8a0.m_create_info.minSampleShading = 0.0;
  local_8a0.m_create_info.pSampleMask._0_1_ = 0;
  local_8a0.m_create_info.pSampleMask._1_7_ = 0;
  local_8a0.m_create_info.pNext = (void *)0x0;
  local_8a0.m_create_info.flags = 0;
  local_8a0.m_create_info.rasterizationSamples = 0;
  local_868 = VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO;
  local_860 = (void *)0x0;
  uStack_858._0_4_ = 0;
  uStack_858._4_4_ = 0;
  local_850._0_4_ = 0;
  local_850._4_4_ = VK_COMPARE_OP_NEVER;
  uStack_848._0_4_ = 0;
  uStack_848._4_4_ = 0;
  local_840._0_4_ = VK_STENCIL_OP_KEEP;
  local_840._4_4_ = VK_STENCIL_OP_KEEP;
  local_840._8_4_ = VK_STENCIL_OP_KEEP;
  local_840._12_4_ = VK_COMPARE_OP_NEVER;
  local_840._16_4_ = 0;
  local_840._20_4_ = 0;
  local_840._24_4_ = 0;
  local_840._28_4_ = VK_STENCIL_OP_KEEP;
  local_820._0_4_ = VK_STENCIL_OP_KEEP;
  local_820._4_4_ = VK_STENCIL_OP_KEEP;
  uStack_818._0_4_ = VK_COMPARE_OP_NEVER;
  uStack_818._4_4_ = 0;
  local_810._0_4_ = 0;
  local_810._4_4_ = 0;
  uStack_808._0_4_ = 0.0;
  uStack_808._4_4_ = 0.0;
  local_800 = false;
  local_7f8.m_color_blend_attachments.
  super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_7f8.m_color_blend_attachments.
  super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_7f8.m_color_blend_attachments.
  super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_7f8.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO;
  local_7f8.m_enable = false;
  local_7f8.m_create_info.blendConstants[0] = 0.0;
  local_7f8.m_create_info.blendConstants[1] = 0.0;
  local_7f8.m_create_info.blendConstants[2] = 0.0;
  local_7f8.m_create_info.blendConstants[3] = 0.0;
  local_7f8.m_create_info.logicOp = VK_LOGIC_OP_CLEAR;
  local_7f8.m_create_info.attachmentCount = 0;
  local_7f8.m_create_info.pAttachments = (VkPipelineColorBlendAttachmentState *)0x0;
  local_7f8.m_create_info.pNext = (void *)0x0;
  local_7f8.m_create_info.flags = 0;
  local_7f8.m_create_info.logicOpEnable = 0;
  local_7a0.m_dynamic_states.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_7a0.m_dynamic_states.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_7a0.m_dynamic_states.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_7a0.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_DYNAMIC_STATE_CREATE_INFO;
  local_7a0.m_create_info.pDynamicStates._0_1_ = 0;
  local_7a0._49_8_ = 0;
  local_7a0.m_create_info.pNext = (void *)0x0;
  local_7a0.m_create_info.flags._0_1_ = 0;
  local_7a0.m_create_info._17_7_ = 0;
  myvk::GraphicsPipelineState::VertexInputState::Enable(&local_9b8);
  myvk::GraphicsPipelineState::InputAssemblyState::Enable
            (&local_950,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,0);
  myvk::GraphicsPipelineState::ViewportState::Enable(&local_908,1,1);
  myvk::GraphicsPipelineState::RasterizationState::Initialize
            ((RasterizationState *)local_9f8,VK_POLYGON_MODE_FILL,VK_FRONT_FACE_COUNTER_CLOCKWISE,1)
  ;
  myvk::GraphicsPipelineState::MultisampleState::Enable(&local_8a0,VK_SAMPLE_COUNT_1_BIT);
  myvk::GraphicsPipelineState::ColorBlendState::Enable(&local_7f8,1,0);
  local_a28._36_8_ = 0x100000000;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)(local_a28 + 0x24);
  std::vector<VkDynamicState,_std::allocator<VkDynamicState>_>::vector
            ((vector<VkDynamicState,_std::allocator<VkDynamicState>_> *)local_a48,__l_02,
             (allocator_type *)&local_a4a);
  myvk::GraphicsPipelineState::DynamicState::Enable
            (&local_7a0,(vector<VkDynamicState,_std::allocator<VkDynamicState>_> *)local_a48);
  if ((element_type *)local_a48._0_8_ != (element_type *)0x0) {
    operator_delete((void *)local_a48._0_8_,local_a48._16_8_ - local_a48._0_8_);
  }
  myvk::GraphicsPipeline::Create
            ((GraphicsPipeline *)local_a48,&this->m_gen_pipeline_layout,&this->m_gen_render_pass,
             (vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
              *)local_a28,(GraphicsPipelineState *)local_9f8,0);
  uVar4 = local_a48._8_8_;
  uVar3 = local_a48._0_8_;
  local_a48._0_8_ = (element_type *)0x0;
  local_a48._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (this->m_gen_graphics_pipeline).
           super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->m_gen_graphics_pipeline).
  super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar3;
  (this->m_gen_graphics_pipeline).
  super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a48._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a48._8_8_);
  }
  if (local_7a0.m_dynamic_states.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_7a0.m_dynamic_states.
                    super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_7a0.m_dynamic_states.
                          super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_7a0.m_dynamic_states.
                          super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_7f8.m_color_blend_attachments.
      super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_7f8.m_color_blend_attachments.
                    super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_7f8.m_color_blend_attachments.
                          super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_7f8.m_color_blend_attachments.
                          super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_908.m_scissors.super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_908.m_scissors.super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_908.m_scissors.
                          super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_908.m_scissors.
                          super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_908.m_viewports.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_908.m_viewports.
                    super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_908.m_viewports.
                          super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_908.m_viewports.
                          super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((VkSpecializationInfo *)
      local_9b8.m_attributes.
      super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
      ._M_impl.super__Vector_impl_data._M_start != (VkSpecializationInfo *)0x0) {
    operator_delete(local_9b8.m_attributes.
                    super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_9b8.m_attributes.
                          super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_9b8.m_attributes.
                          super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_9b8.m_bindings.
      super__Vector_base<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_9b8.m_bindings.
                    super__Vector_base<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_9b8.m_bindings.
                          super__Vector_base<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_9b8.m_bindings.
                          super__Vector_base<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((pointer)local_a28._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_a28._0_8_,local_a28._16_8_ - local_a28._0_8_);
  }
  if ((element_type *)this_01 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
  }
  if ((element_type *)this_00 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
  }
  return;
}

Assistant:

void PathTracerViewer::create_gen_graphics_pipeline(const std::shared_ptr<myvk::Device> &device) {
	m_gen_pipeline_layout = myvk::PipelineLayout::Create(device, {m_path_tracer_ptr->GetTargetDescriptorSetLayout()},
	                                                     {{VK_SHADER_STAGE_FRAGMENT_BIT, 0, sizeof(uint32_t)}});
	constexpr uint32_t kPathTracerViewerGenFragSpirv[] = {
#include "spirv/path_tracer_viewer_gen.frag.u32"
	};

	std::shared_ptr<myvk::ShaderModule> vert_shader_module, frag_shader_module;
	vert_shader_module = myvk::ShaderModule::Create(device, kQuadVertSpv, sizeof(kQuadVertSpv));
	frag_shader_module =
	    myvk::ShaderModule::Create(device, kPathTracerViewerGenFragSpirv, sizeof(kPathTracerViewerGenFragSpirv));

	std::vector<VkPipelineShaderStageCreateInfo> shader_stages = {
	    vert_shader_module->GetPipelineShaderStageCreateInfo(VK_SHADER_STAGE_VERTEX_BIT),
	    frag_shader_module->GetPipelineShaderStageCreateInfo(VK_SHADER_STAGE_FRAGMENT_BIT)};

	myvk::GraphicsPipelineState pipeline_state = {};
	pipeline_state.m_vertex_input_state.Enable();
	pipeline_state.m_input_assembly_state.Enable(VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST);
	pipeline_state.m_viewport_state.Enable(1, 1);
	pipeline_state.m_rasterization_state.Initialize(VK_POLYGON_MODE_FILL, VK_FRONT_FACE_COUNTER_CLOCKWISE,
	                                                VK_CULL_MODE_FRONT_BIT);
	pipeline_state.m_multisample_state.Enable(VK_SAMPLE_COUNT_1_BIT);
	pipeline_state.m_color_blend_state.Enable(1, VK_FALSE);
	pipeline_state.m_dynamic_state.Enable({VK_DYNAMIC_STATE_VIEWPORT, VK_DYNAMIC_STATE_SCISSOR});

	m_gen_graphics_pipeline =
	    myvk::GraphicsPipeline::Create(m_gen_pipeline_layout, m_gen_render_pass, shader_stages, pipeline_state, 0);
}